

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

char * luaT_objtypename(lua_State *L,TValue *o)

{
  TString *key;
  TValue *pTVar1;
  code *local_40;
  TValue *name;
  Table *mt;
  TValue *o_local;
  lua_State *L_local;
  
  if (((o->tt_ == 'E') && (name = *(TValue **)((o->value_).f + 0x20), name != (TValue *)0x0)) ||
     ((o->tt_ == 'G' && (name = *(TValue **)((o->value_).f + 0x18), name != (TValue *)0x0)))) {
    key = luaS_new(L,"__name");
    pTVar1 = luaH_Hgetshortstr((Table *)name,key);
    if ((pTVar1->tt_ & 0xf) == 4) {
      if ((char)(pTVar1->value_).f[0xb] < '\0') {
        local_40 = *(code **)((pTVar1->value_).f + 0x18);
      }
      else {
        local_40 = (pTVar1->value_).f + 0x18;
      }
      return (char *)local_40;
    }
  }
  return luaT_typenames_[(int)((o->tt_ & 0xf) + 1)];
}

Assistant:

const char *luaT_objtypename (lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttistable(o) && (mt = hvalue(o)->metatable) != NULL) ||
      (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_Hgetshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  return ttypename(ttype(o));  /* else use standard type name */
}